

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::Tree::_set_hierarchy(Tree *this,size_t ichild,size_t iparent,size_t iprev_sibling)

{
  size_t *psVar1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  NodeData *n;
  bool bVar12;
  ulong uVar13;
  NodeData *pNVar14;
  size_t sVar15;
  size_t sVar16;
  long lVar17;
  NodeData *n_00;
  char *pcVar18;
  char *pcVar19;
  NodeData *pNVar20;
  byte bVar21;
  char msg [69];
  char local_218 [64];
  undefined4 local_1d8;
  undefined1 local_1d4;
  undefined4 uStack_1c8;
  undefined3 uStack_1c4;
  undefined4 local_1c0;
  undefined1 local_1bc;
  size_t *local_1b0;
  size_t local_1a8;
  NodeData *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  char *pcStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  char *pcStack_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  char *pcStack_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  char *pcStack_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  bVar21 = 0;
  uVar13 = this->m_cap;
  if (uVar13 <= iparent && iparent != 0xffffffffffffffff) {
    pcVar18 = "check failed: (iparent == NONE || (iparent >= 0 && iparent < m_cap))";
    pcVar19 = local_218;
    for (lVar17 = 8; lVar17 != 0; lVar17 = lVar17 + -1) {
      *(undefined8 *)pcVar19 = *(undefined8 *)pcVar18;
      pcVar18 = pcVar18 + 8;
      pcVar19 = pcVar19 + 8;
    }
    local_1d4 = 0;
    local_1d8 = 0x29297061;
    if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_58 = 0;
    uStack_50 = 0x63cb;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x63cb) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x63cb) << 0x40,8);
    LVar3.name.str._0_4_ = 0x1fcdc7;
    LVar3.name.str._4_4_ = 0;
    LVar3.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_218,0x45,LVar3,(this->m_callbacks).m_user_data);
    uVar13 = this->m_cap;
  }
  if ((iprev_sibling != 0xffffffffffffffff) && (uVar13 <= iprev_sibling)) {
    pcVar18 = 
    "check failed: (iprev_sibling == NONE || (iprev_sibling >= 0 && iprev_sibling < m_cap))";
    pcVar19 = local_218;
    for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
      *(undefined8 *)pcVar19 = *(undefined8 *)pcVar18;
      pcVar18 = pcVar18 + ((ulong)bVar21 * -2 + 1) * 8;
      pcVar19 = pcVar19 + ((ulong)bVar21 * -2 + 1) * 8;
    }
    uStack_1c4 = 0x2929;
    uStack_1c8 = 0x7061635f;
    if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_80 = 0;
    uStack_78 = 0x63cc;
    local_70 = 0;
    pcStack_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_60 = 0x65;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x63cc) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x63cc) << 0x40,8);
    LVar4.name.str._0_4_ = 0x1fcdc7;
    LVar4.name.str._4_4_ = 0;
    LVar4.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_218,0x57,LVar4,(this->m_callbacks).m_user_data);
  }
  if (ichild == 0xffffffffffffffff) {
    _DAT_00000088 = 0xffffffffffffffff;
    _DAT_00000080 = 0xffffffffffffffff;
    _DAT_00000068 = iparent;
    if (iparent != 0xffffffffffffffff) {
      local_1a0 = (NodeData *)0x0;
      local_1b0 = (size_t *)&DAT_00000080;
      goto LAB_001bd4f8;
    }
  }
  else {
    if (this->m_cap <= ichild) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_218[0] = '\0';
      local_218[1] = '\0';
      local_218[2] = '\0';
      local_218[3] = '\0';
      local_218[4] = '\0';
      local_218[5] = '\0';
      local_218[6] = '\0';
      local_218[7] = '\0';
      local_218[8] = 't';
      local_218[9] = 'K';
      local_218[10] = '\0';
      local_218[0xb] = '\0';
      local_218[0xc] = '\0';
      local_218[0xd] = '\0';
      local_218[0xe] = '\0';
      local_218[0xf] = '\0';
      local_218[0x10] = '\0';
      local_218[0x11] = '\0';
      local_218[0x12] = '\0';
      local_218[0x13] = '\0';
      local_218[0x14] = '\0';
      local_218[0x15] = '\0';
      local_218[0x16] = '\0';
      local_218[0x17] = '\0';
      local_218[0x18] = -0x39;
      local_218[0x19] = -0x33;
      local_218[0x1a] = '\x1f';
      local_218[0x1b] = '\0';
      local_218[0x1c] = 0;
      local_218[0x1d] = 0;
      local_218[0x1e] = '\0';
      local_218[0x1f] = '\0';
      local_218[0x20] = 'e';
      local_218[0x21] = '\0';
      local_218[0x22] = '\0';
      local_218[0x23] = '\0';
      local_218[0x24] = '\0';
      local_218[0x25] = 0;
      local_218[0x26] = '\0';
      local_218[0x27] = '\0';
      (*(code *)PTR_error_impl_0023f548)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    pNVar20 = this->m_buf;
    pNVar20[ichild].m_parent = iparent;
    psVar1 = &pNVar20[ichild].m_next_sibling;
    *(undefined4 *)psVar1 = 0xffffffff;
    *(undefined4 *)((long)psVar1 + 4) = 0xffffffff;
    *(undefined4 *)(psVar1 + 1) = 0xffffffff;
    *(undefined4 *)((long)psVar1 + 0xc) = 0xffffffff;
    if (iparent != 0xffffffffffffffff) {
      local_1a0 = pNVar20 + ichild;
      local_1b0 = &pNVar20[ichild].m_next_sibling;
LAB_001bd4f8:
      if (iprev_sibling == 0xffffffffffffffff) {
        local_1a8 = first_child(this,iparent);
        if (this->m_cap <= iparent) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_218[0] = '\0';
          local_218[1] = '\0';
          local_218[2] = '\0';
          local_218[3] = '\0';
          local_218[4] = '\0';
          local_218[5] = '\0';
          local_218[6] = '\0';
          local_218[7] = '\0';
          local_218[8] = 't';
          local_218[9] = 'K';
          local_218[10] = '\0';
          local_218[0xb] = '\0';
          local_218[0xc] = '\0';
          local_218[0xd] = '\0';
          local_218[0xe] = '\0';
          local_218[0xf] = '\0';
          local_218[0x10] = '\0';
          local_218[0x11] = '\0';
          local_218[0x12] = '\0';
          local_218[0x13] = '\0';
          local_218[0x14] = '\0';
          local_218[0x15] = '\0';
          local_218[0x16] = '\0';
          local_218[0x17] = '\0';
          local_218[0x18] = -0x39;
          local_218[0x19] = -0x33;
          local_218[0x1a] = '\x1f';
          local_218[0x1b] = '\0';
          local_218[0x1c] = 0;
          local_218[0x1d] = 0;
          local_218[0x1e] = '\0';
          local_218[0x1f] = '\0';
          local_218[0x20] = 'e';
          local_218[0x21] = '\0';
          local_218[0x22] = '\0';
          local_218[0x23] = '\0';
          local_218[0x24] = '\0';
          local_218[0x25] = 0;
          local_218[0x26] = '\0';
          local_218[0x27] = '\0';
          (*(code *)PTR_error_impl_0023f548)
                    ("check failed: i >= 0 && i < m_cap",0x21,
                     (anonymous_namespace)::s_default_callbacks);
        }
        pNVar14 = this->m_buf;
        n_00 = (NodeData *)0x0;
        pNVar20 = pNVar14;
      }
      else {
        local_1a8 = next_sibling(this,iprev_sibling);
        uVar13 = this->m_cap;
        if (uVar13 <= iparent) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_218[0] = '\0';
          local_218[1] = '\0';
          local_218[2] = '\0';
          local_218[3] = '\0';
          local_218[4] = '\0';
          local_218[5] = '\0';
          local_218[6] = '\0';
          local_218[7] = '\0';
          local_218[8] = 't';
          local_218[9] = 'K';
          local_218[10] = '\0';
          local_218[0xb] = '\0';
          local_218[0xc] = '\0';
          local_218[0xd] = '\0';
          local_218[0xe] = '\0';
          local_218[0xf] = '\0';
          local_218[0x10] = '\0';
          local_218[0x11] = '\0';
          local_218[0x12] = '\0';
          local_218[0x13] = '\0';
          local_218[0x14] = '\0';
          local_218[0x15] = '\0';
          local_218[0x16] = '\0';
          local_218[0x17] = '\0';
          local_218[0x18] = -0x39;
          local_218[0x19] = -0x33;
          local_218[0x1a] = '\x1f';
          local_218[0x1b] = '\0';
          local_218[0x1c] = 0;
          local_218[0x1d] = 0;
          local_218[0x1e] = '\0';
          local_218[0x1f] = '\0';
          local_218[0x20] = 'e';
          local_218[0x21] = '\0';
          local_218[0x22] = '\0';
          local_218[0x23] = '\0';
          local_218[0x24] = '\0';
          local_218[0x25] = 0;
          local_218[0x26] = '\0';
          local_218[0x27] = '\0';
          (*(code *)PTR_error_impl_0023f548)
                    ("check failed: i >= 0 && i < m_cap",0x21,
                     (anonymous_namespace)::s_default_callbacks);
          uVar13 = this->m_cap;
        }
        pNVar20 = this->m_buf;
        pNVar14 = pNVar20;
        if (uVar13 <= iprev_sibling) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_218[0] = '\0';
          local_218[1] = '\0';
          local_218[2] = '\0';
          local_218[3] = '\0';
          local_218[4] = '\0';
          local_218[5] = '\0';
          local_218[6] = '\0';
          local_218[7] = '\0';
          local_218[8] = 't';
          local_218[9] = 'K';
          local_218[10] = '\0';
          local_218[0xb] = '\0';
          local_218[0xc] = '\0';
          local_218[0xd] = '\0';
          local_218[0xe] = '\0';
          local_218[0xf] = '\0';
          local_218[0x10] = '\0';
          local_218[0x11] = '\0';
          local_218[0x12] = '\0';
          local_218[0x13] = '\0';
          local_218[0x14] = '\0';
          local_218[0x15] = '\0';
          local_218[0x16] = '\0';
          local_218[0x17] = '\0';
          local_218[0x18] = -0x39;
          local_218[0x19] = -0x33;
          local_218[0x1a] = '\x1f';
          local_218[0x1b] = '\0';
          local_218[0x1c] = 0;
          local_218[0x1d] = 0;
          local_218[0x1e] = '\0';
          local_218[0x1f] = '\0';
          local_218[0x20] = 'e';
          local_218[0x21] = '\0';
          local_218[0x22] = '\0';
          local_218[0x23] = '\0';
          local_218[0x24] = '\0';
          local_218[0x25] = 0;
          local_218[0x26] = '\0';
          local_218[0x27] = '\0';
          (*(code *)PTR_error_impl_0023f548)
                    ("check failed: i >= 0 && i < m_cap",0x21,
                     (anonymous_namespace)::s_default_callbacks);
          pNVar14 = this->m_buf;
        }
        n_00 = pNVar14 + iprev_sibling;
      }
      sVar15 = local_1a8;
      if (local_1a8 == 0xffffffffffffffff) {
        pNVar14 = (NodeData *)0x0;
      }
      else {
        if (this->m_cap <= local_1a8) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_218[0] = '\0';
          local_218[1] = '\0';
          local_218[2] = '\0';
          local_218[3] = '\0';
          local_218[4] = '\0';
          local_218[5] = '\0';
          local_218[6] = '\0';
          local_218[7] = '\0';
          local_218[8] = 't';
          local_218[9] = 'K';
          local_218[10] = '\0';
          local_218[0xb] = '\0';
          local_218[0xc] = '\0';
          local_218[0xd] = '\0';
          local_218[0xe] = '\0';
          local_218[0xf] = '\0';
          local_218[0x10] = '\0';
          local_218[0x11] = '\0';
          local_218[0x12] = '\0';
          local_218[0x13] = '\0';
          local_218[0x14] = '\0';
          local_218[0x15] = '\0';
          local_218[0x16] = '\0';
          local_218[0x17] = '\0';
          local_218[0x18] = -0x39;
          local_218[0x19] = -0x33;
          local_218[0x1a] = '\x1f';
          local_218[0x1b] = '\0';
          local_218[0x1c] = 0;
          local_218[0x1d] = 0;
          local_218[0x1e] = '\0';
          local_218[0x1f] = '\0';
          local_218[0x20] = 'e';
          local_218[0x21] = '\0';
          local_218[0x22] = '\0';
          local_218[0x23] = '\0';
          local_218[0x24] = '\0';
          local_218[0x25] = 0;
          local_218[0x26] = '\0';
          local_218[0x27] = '\0';
          (*(code *)PTR_error_impl_0023f548)
                    ("check failed: i >= 0 && i < m_cap",0x21,
                     (anonymous_namespace)::s_default_callbacks);
          pNVar14 = this->m_buf;
        }
        pNVar14 = pNVar14 + sVar15;
      }
      if (n_00 != (NodeData *)0x0) {
        sVar15 = next_sibling(this,iprev_sibling);
        sVar16 = id(this,pNVar14);
        if (sVar15 != sVar16) {
          builtin_strncpy(local_218,"check failed: (next_sibling(iprev_sibling) == id(nsib))",0x38);
          if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_f8 = 0;
          uStack_f0 = 0x63e4;
          local_e8 = 0;
          pcStack_e0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_d8 = 0x65;
          LVar7.super_LineCol.col = 0;
          LVar7.super_LineCol.offset = SUB168(ZEXT816(0x63e4) << 0x40,0);
          LVar7.super_LineCol.line = SUB168(ZEXT816(0x63e4) << 0x40,8);
          LVar7.name.str._0_4_ = 0x1fcdc7;
          LVar7.name.str._4_4_ = 0;
          LVar7.name.len = 0x65;
          (*(this->m_callbacks).m_error)(local_218,0x38,LVar7,(this->m_callbacks).m_user_data);
        }
        sVar15 = id(this,n_00);
        local_1a0->m_prev_sibling = sVar15;
        sVar15 = id(this,local_1a0);
        n_00->m_next_sibling = sVar15;
        if (n_00->m_prev_sibling != 0xffffffffffffffff && n_00->m_prev_sibling == sVar15) {
          pcVar18 = 
          "check failed: (psib->m_prev_sibling != psib->m_next_sibling || psib->m_prev_sibling == NONE)"
          ;
          pcVar19 = local_218;
          for (lVar17 = 0xb; lVar17 != 0; lVar17 = lVar17 + -1) {
            *(undefined8 *)pcVar19 = *(undefined8 *)pcVar18;
            pcVar18 = pcVar18 + ((ulong)bVar21 * -2 + 1) * 8;
            pcVar19 = pcVar19 + ((ulong)bVar21 * -2 + 1) * 8;
          }
          local_1bc = 0;
          local_1c0 = 0x29454e4f;
          if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_120 = 0;
          uStack_118 = 0x63e7;
          local_110 = 0;
          pcStack_108 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_100 = 0x65;
          LVar8.super_LineCol.col = 0;
          LVar8.super_LineCol.offset = SUB168(ZEXT816(0x63e7) << 0x40,0);
          LVar8.super_LineCol.line = SUB168(ZEXT816(0x63e7) << 0x40,8);
          LVar8.name.str._0_4_ = 0x1fcdc7;
          LVar8.name.str._4_4_ = 0;
          LVar8.name.len = 0x65;
          (*(this->m_callbacks).m_error)(local_218,0x5d,LVar8,(this->m_callbacks).m_user_data);
        }
      }
      n = local_1a0;
      if (pNVar14 != (NodeData *)0x0) {
        sVar15 = prev_sibling(this,local_1a8);
        sVar16 = id(this,n_00);
        if (sVar15 != sVar16) {
          builtin_strncpy(local_218,"check failed: (prev_sibling(inext_sibling) == id(psib))",0x38);
          if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_148 = 0;
          uStack_140 = 0x63ec;
          local_138 = 0;
          pcStack_130 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_128 = 0x65;
          LVar9.super_LineCol.col = 0;
          LVar9.super_LineCol.offset = SUB168(ZEXT816(0x63ec) << 0x40,0);
          LVar9.super_LineCol.line = SUB168(ZEXT816(0x63ec) << 0x40,8);
          LVar9.name.str._0_4_ = 0x1fcdc7;
          LVar9.name.str._4_4_ = 0;
          LVar9.name.len = 0x65;
          (*(this->m_callbacks).m_error)(local_218,0x38,LVar9,(this->m_callbacks).m_user_data);
        }
        sVar15 = id(this,pNVar14);
        *local_1b0 = sVar15;
        sVar15 = id(this,n);
        pNVar14->m_prev_sibling = sVar15;
        if ((sVar15 != 0xffffffffffffffff) && (sVar15 == pNVar14->m_next_sibling)) {
          pcVar18 = 
          "check failed: (nsib->m_prev_sibling != nsib->m_next_sibling || nsib->m_prev_sibling == NONE)"
          ;
          pcVar19 = local_218;
          for (lVar17 = 0xb; lVar17 != 0; lVar17 = lVar17 + -1) {
            *(undefined8 *)pcVar19 = *(undefined8 *)pcVar18;
            pcVar18 = pcVar18 + ((ulong)bVar21 * -2 + 1) * 8;
            pcVar19 = pcVar19 + ((ulong)bVar21 * -2 + 1) * 8;
          }
          local_1bc = 0;
          local_1c0 = 0x29454e4f;
          if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_170 = 0;
          uStack_168 = 0x63ef;
          local_160 = 0;
          pcStack_158 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_150 = 0x65;
          LVar10.super_LineCol.col = 0;
          LVar10.super_LineCol.offset = SUB168(ZEXT816(0x63ef) << 0x40,0);
          LVar10.super_LineCol.line = SUB168(ZEXT816(0x63ef) << 0x40,8);
          LVar10.name.str._0_4_ = 0x1fcdc7;
          LVar10.name.str._4_4_ = 0;
          LVar10.name.len = 0x65;
          (*(this->m_callbacks).m_error)(local_218,0x5d,LVar10,(this->m_callbacks).m_user_data);
        }
      }
      if (pNVar20[iparent].m_first_child == 0xffffffffffffffff) {
        if (pNVar20[iparent].m_last_child != 0xffffffffffffffff) {
          builtin_strncpy(local_218 + 0x20,"ild == NONE)",0xd);
          builtin_strncpy(local_218 + 0x10,"arent->m_last_ch",0x10);
          builtin_strncpy(local_218,"check failed: (p",0x10);
          if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_198 = 0;
          uStack_190 = 0x63f4;
          local_188 = 0;
          pcStack_180 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_178 = 0x65;
          LVar11.super_LineCol.col = 0;
          LVar11.super_LineCol.offset = SUB168(ZEXT816(0x63f4) << 0x40,0);
          LVar11.super_LineCol.line = SUB168(ZEXT816(0x63f4) << 0x40,8);
          LVar11.name.str._0_4_ = 0x1fcdc7;
          LVar11.name.str._4_4_ = 0;
          LVar11.name.len = 0x65;
          (*(this->m_callbacks).m_error)(local_218,0x2d,LVar11,(this->m_callbacks).m_user_data);
        }
        sVar15 = id(this,n);
        pNVar20[iparent].m_first_child = sVar15;
      }
      else {
        if (*local_1b0 == pNVar20[iparent].m_first_child) {
          sVar15 = id(this,n);
          pNVar20[iparent].m_first_child = sVar15;
        }
        if (n->m_prev_sibling != pNVar20[iparent].m_last_child) {
          return;
        }
      }
      sVar15 = id(this,n);
      pNVar20[iparent].m_last_child = sVar15;
      return;
    }
    if (ichild == 0) goto LAB_001bd6e3;
  }
  builtin_strncpy(local_218 + 0x10,"child == 0)",0xc);
  builtin_strncpy(local_218,"check failed: (i",0x10);
  if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
    pcVar2 = (code *)swi(3);
    (*pcVar2)();
    return;
  }
  local_a8 = 0;
  uStack_a0 = 0x63d6;
  local_98 = 0;
  pcStack_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  local_88 = 0x65;
  LVar5.super_LineCol.col = 0;
  LVar5.super_LineCol.offset = SUB168(ZEXT816(0x63d6) << 0x40,0);
  LVar5.super_LineCol.line = SUB168(ZEXT816(0x63d6) << 0x40,8);
  LVar5.name.str._0_4_ = 0x1fcdc7;
  LVar5.name.str._4_4_ = 0;
  LVar5.name.len = 0x65;
  (*(this->m_callbacks).m_error)(local_218,0x1c,LVar5,(this->m_callbacks).m_user_data);
LAB_001bd6e3:
  if (iprev_sibling == 0xffffffffffffffff) {
    return;
  }
  builtin_strncpy(local_218,"check failed: (iprev_sibling == NONE)",0x26);
  if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
    pcVar2 = (code *)swi(3);
    (*pcVar2)();
    return;
  }
  local_d0 = 0;
  uStack_c8 = 0x63d7;
  local_c0 = 0;
  pcStack_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  local_b0 = 0x65;
  LVar6.super_LineCol.col = 0;
  LVar6.super_LineCol.offset = SUB168(ZEXT816(0x63d7) << 0x40,0);
  LVar6.super_LineCol.line = SUB168(ZEXT816(0x63d7) << 0x40,8);
  LVar6.name.str._0_4_ = 0x1fcdc7;
  LVar6.name.str._4_4_ = 0;
  LVar6.name.len = 0x65;
  (*(this->m_callbacks).m_error)(local_218,0x26,LVar6,(this->m_callbacks).m_user_data);
  return;
}

Assistant:

void Tree::_set_hierarchy(size_t ichild, size_t iparent, size_t iprev_sibling)
{
    _RYML_CB_ASSERT(m_callbacks, iparent == NONE || (iparent >= 0 && iparent < m_cap));
    _RYML_CB_ASSERT(m_callbacks, iprev_sibling == NONE || (iprev_sibling >= 0 && iprev_sibling < m_cap));

    NodeData *C4_RESTRICT child = get(ichild);

    child->m_parent = iparent;
    child->m_prev_sibling = NONE;
    child->m_next_sibling = NONE;

    if(iparent == NONE)
    {
        _RYML_CB_ASSERT(m_callbacks, ichild == 0);
        _RYML_CB_ASSERT(m_callbacks, iprev_sibling == NONE);
    }

    if(iparent == NONE)
        return;

    size_t inext_sibling = iprev_sibling != NONE ? next_sibling(iprev_sibling) : first_child(iparent);
    NodeData *C4_RESTRICT parent = get(iparent);
    NodeData *C4_RESTRICT psib   = get(iprev_sibling);
    NodeData *C4_RESTRICT nsib   = get(inext_sibling);

    if(psib)
    {
        _RYML_CB_ASSERT(m_callbacks, next_sibling(iprev_sibling) == id(nsib));
        child->m_prev_sibling = id(psib);
        psib->m_next_sibling = id(child);
        _RYML_CB_ASSERT(m_callbacks, psib->m_prev_sibling != psib->m_next_sibling || psib->m_prev_sibling == NONE);
    }

    if(nsib)
    {
        _RYML_CB_ASSERT(m_callbacks, prev_sibling(inext_sibling) == id(psib));
        child->m_next_sibling = id(nsib);
        nsib->m_prev_sibling = id(child);
        _RYML_CB_ASSERT(m_callbacks, nsib->m_prev_sibling != nsib->m_next_sibling || nsib->m_prev_sibling == NONE);
    }

    if(parent->m_first_child == NONE)
    {
        _RYML_CB_ASSERT(m_callbacks, parent->m_last_child == NONE);
        parent->m_first_child = id(child);
        parent->m_last_child = id(child);
    }
    else
    {
        if(child->m_next_sibling == parent->m_first_child)
            parent->m_first_child = id(child);

        if(child->m_prev_sibling == parent->m_last_child)
            parent->m_last_child = id(child);
    }
}